

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O1

int V_GetColor(DWORD *palette,char *str)

{
  int iVar1;
  FString string;
  FString local_20;
  
  V_GetColorStringByName((char *)&local_20);
  if (*(int *)(local_20.Chars + -0xc) == 0) {
    local_20.Chars = str;
  }
  iVar1 = V_GetColorFromString(palette,local_20.Chars);
  FString::~FString(&local_20);
  return iVar1;
}

Assistant:

int V_GetColor (const DWORD *palette, const char *str)
{
	FString string = V_GetColorStringByName (str);
	int res;

	if (!string.IsEmpty())
	{
		res = V_GetColorFromString (palette, string);
	}
	else
	{
		res = V_GetColorFromString (palette, str);
	}
	return res;
}